

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitModuleExportAccess
          (ByteCodeGenerator *this,Symbol *sym,OpCode opcode,RegSlot location,FuncInfo *funcInfo)

{
  bool bVar1;
  ByteCodeWriter *this_00;
  
  bVar1 = EnsureSymbolModuleSlots(this,sym,funcInfo);
  this_00 = &this->m_writer;
  if (bVar1) {
    Js::ByteCodeWriter::SlotI2(this_00,opcode,location,sym->moduleIndex,sym->scopeSlot);
    return;
  }
  Js::ByteCodeWriter::W1(this_00,RuntimeReferenceError,0x43f);
  if (opcode == LdModuleSlot) {
    Js::ByteCodeWriter::Reg1(this_00,LdUndef,location);
    return;
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitModuleExportAccess(Symbol* sym, Js::OpCode opcode, Js::RegSlot location, FuncInfo* funcInfo)
{
    if (EnsureSymbolModuleSlots(sym, funcInfo))
    {
        this->Writer()->SlotI2(opcode, location, sym->GetModuleIndex(), sym->GetScopeSlot());
    }
    else
    {
        this->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(ERRInvalidExportName));

        if (opcode == Js::OpCode::LdModuleSlot)
        {
            this->Writer()->Reg1(Js::OpCode::LdUndef, location);
        }
    }
}